

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::String::ShowWideCStringQuoted(wchar_t *wide_c_str)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  long in_RSI;
  String *in_RDI;
  String SVar3;
  String *this;
  char *in_stack_ffffffffffffffb8;
  String *format;
  wchar_t *in_stack_ffffffffffffffe8;
  
  if (in_RSI == 0) {
    String(in_RDI,in_stack_ffffffffffffffb8);
    sVar2 = extraout_RDX;
  }
  else {
    this = (String *)&stack0xffffffffffffffe0;
    format = in_RDI;
    ShowWideCString(in_stack_ffffffffffffffe8);
    pcVar1 = c_str(this);
    Format((char *)format,"L\"%s\"",pcVar1);
    ~String(this);
    sVar2 = extraout_RDX_00;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)in_RDI;
  return SVar3;
}

Assistant:

String String::ShowWideCStringQuoted(const wchar_t* wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String::Format("L\"%s\"",
                        String::ShowWideCString(wide_c_str).c_str());
}